

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
           *this,size_t hash,try_emplace_args_t *args,Entry *args_1)

{
  long in_RSI;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
  *in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  *in_R8;
  locator *it;
  arrays_type new_arrays_;
  arrays_type *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  group15<boost::unordered::detail::foa::plain_integral> *local_58;
  try_emplace_args_t *in_stack_ffffffffffffffb0;
  pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
  *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  arrays_type *in_stack_ffffffffffffffc8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  *in_stack_ffffffffffffffd0;
  value_type_pointer in_stack_ffffffffffffffd8;
  
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::new_arrays_for_growth
            ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
              *)&stack0xffffffffffffffc0);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
  ::table_locator(in_RDI);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::position_for(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (size_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(Entry *)in_R8);
  in_RDI->pg = local_58;
  *(try_emplace_args_t **)&in_RDI->n = in_stack_ffffffffffffffb0;
  in_RDI->p = in_stack_ffffffffffffffb8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::unchecked_rehash(in_R8,(arrays_type *)in_stack_ffffffffffffffd8);
  *(long *)(in_RSI + 0x28) = *(long *)(in_RSI + 0x28) + 1;
  return in_RDI;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }